

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::
PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
::~PolymorphicMatcher
          (PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->impl_).whose_property_._M_dataplus._M_p;
  paVar1 = &(this->impl_).whose_property_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            (&(this->impl_).matcher_.super_MatcherBase<const_int_&>);
  return;
}

Assistant:

explicit PolymorphicMatcher(const Impl& an_impl) : impl_(an_impl) {}